

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::FlushNewSessionTickets(SSL *client,SSL *server)

{
  uint ret_code;
  uint uVar1;
  uint uVar2;
  int client_err;
  int client_ret;
  int server_err;
  int server_ret;
  SSL *server_local;
  SSL *client_local;
  
  while( true ) {
    ret_code = SSL_write((SSL *)server,(void *)0x0,0);
    uVar1 = SSL_get_error((SSL *)server,ret_code);
    if ((0 < (int)ret_code) || (((int)ret_code < 0 && (uVar1 != 3)))) break;
    uVar1 = SSL_read((SSL *)client,(void *)0x0,0);
    uVar2 = SSL_get_error((SSL *)client,uVar1);
    if ((uVar1 != 0xffffffff) || (uVar2 != 2)) {
      fprintf(_stderr,"Unexpected client result: %d %d\n",(ulong)uVar1,(ulong)uVar2);
      return false;
    }
    if (ret_code == 0) {
      return true;
    }
  }
  fprintf(_stderr,"Unexpected server result: %d %d\n",(ulong)ret_code,(ulong)uVar1);
  return false;
}

Assistant:

static bool FlushNewSessionTickets(SSL *client, SSL *server) {
  // NewSessionTickets are deferred on the server to |SSL_write|, and clients do
  // not pick them up until |SSL_read|.
  for (;;) {
    int server_ret = SSL_write(server, nullptr, 0);
    int server_err = SSL_get_error(server, server_ret);
    // The server may either succeed (|server_ret| is zero) or block on write
    // (|server_ret| is -1 and |server_err| is |SSL_ERROR_WANT_WRITE|).
    if (server_ret > 0 ||
        (server_ret < 0 && server_err != SSL_ERROR_WANT_WRITE)) {
      fprintf(stderr, "Unexpected server result: %d %d\n", server_ret,
              server_err);
      return false;
    }

    int client_ret = SSL_read(client, nullptr, 0);
    int client_err = SSL_get_error(client, client_ret);
    // The client must always block on read.
    if (client_ret != -1 || client_err != SSL_ERROR_WANT_READ) {
      fprintf(stderr, "Unexpected client result: %d %d\n", client_ret,
              client_err);
      return false;
    }

    // The server flushed everything it had to write.
    if (server_ret == 0) {
      return true;
    }
  }
}